

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O0

int __thiscall
dynet::NaryTreeLSTMBuilder::copy(NaryTreeLSTMBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_type sVar1;
  reference pvVar2;
  const_reference this_00;
  const_reference pvVar3;
  reference pvVar4;
  size_t j;
  size_t i;
  NaryTreeLSTMBuilder *rnn_treelstm;
  ulong local_28;
  ulong local_20;
  
  local_20 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
            ::size(&this->params);
    if (sVar1 <= local_20) break;
    local_28 = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
               ::operator[](&this->params,local_20);
      sVar1 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::size(pvVar2);
      if (sVar1 <= local_28) break;
      this_00 = std::
                vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                ::operator[]((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                              *)(dst + 0xd0),local_20);
      pvVar3 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (this_00,local_28);
      pvVar2 = std::
               vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
               ::operator[](&this->params,local_20);
      pvVar4 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (pvVar2,local_28);
      pvVar4->p = pvVar3->p;
      local_28 = local_28 + 1;
    }
    local_20 = local_20 + 1;
  }
  return (int)local_20;
}

Assistant:

void NaryTreeLSTMBuilder::copy(const RNNBuilder & rnn) {
  const NaryTreeLSTMBuilder & rnn_treelstm = (const NaryTreeLSTMBuilder&)rnn;
  DYNET_ASSERT(params.size() == rnn_treelstm.params.size(), "Failed dimension check in TreeLSTMBuilder");
  for(size_t i = 0; i < params.size(); ++i) {
    for(size_t j = 0; j < params[i].size(); ++j) {
      params[i][j] = rnn_treelstm.params[i][j];
    }
  }
}